

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

UINT16 calculateChecksum16(UINT16 *buffer,UINT32 bufferSize)

{
  uint local_24;
  short local_1e;
  UINT32 index;
  UINT16 counter;
  UINT32 bufferSize_local;
  UINT16 *buffer_local;
  
  if (buffer == (UINT16 *)0x0) {
    buffer_local._6_2_ = 0;
  }
  else {
    local_1e = 0;
    for (local_24 = 0; local_24 < bufferSize >> 1; local_24 = local_24 + 1) {
      local_1e = local_1e + buffer[local_24];
    }
    buffer_local._6_2_ = -local_1e;
  }
  return buffer_local._6_2_;
}

Assistant:

UINT16 calculateChecksum16(const UINT16* buffer, UINT32 bufferSize)
{
    if (!buffer)
        return 0;
    
    UINT16 counter = 0;
    UINT32 index = 0;
    
    bufferSize /= sizeof(UINT16);
    
    for (; index < bufferSize; index++) {
        counter = (UINT16)(counter + buffer[index]);
    }
    
    return (UINT16)(0x10000 - counter);
}